

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOrder.c
# Opt level: O0

void Abc_NtkChangeCiOrder(Abc_Ntk_t *pNtk,Vec_Ptr_t *vSupp,int fReverse)

{
  Vec_Ptr_t *p;
  int iVar1;
  int iVar2;
  void *pvVar3;
  Abc_Obj_t *pObj_00;
  int local_2c;
  int i;
  Abc_Obj_t *pObj;
  int fReverse_local;
  Vec_Ptr_t *vSupp_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Vec_PtrSize(vSupp);
  iVar2 = Abc_NtkCiNum(pNtk);
  if (iVar1 == iVar2) {
    if (fReverse == 0) {
      for (local_2c = 0; iVar1 = Vec_PtrSize(vSupp), local_2c < iVar1; local_2c = local_2c + 1) {
        pvVar3 = Vec_PtrEntry(vSupp,local_2c);
        Vec_PtrWriteEntry(pNtk->vCis,local_2c,pvVar3);
      }
    }
    else {
      for (local_2c = 0; iVar1 = Vec_PtrSize(vSupp), local_2c < iVar1; local_2c = local_2c + 1) {
        pvVar3 = Vec_PtrEntry(vSupp,local_2c);
        p = pNtk->vCis;
        iVar1 = Vec_PtrSize(vSupp);
        Vec_PtrWriteEntry(p,(iVar1 + -1) - local_2c,pvVar3);
      }
    }
    Vec_PtrClear(pNtk->vPis);
    for (local_2c = 0; iVar1 = Abc_NtkCiNum(pNtk), local_2c < iVar1; local_2c = local_2c + 1) {
      pObj_00 = Abc_NtkCi(pNtk,local_2c);
      iVar1 = Abc_ObjIsPi(pObj_00);
      if (iVar1 != 0) {
        Vec_PtrPush(pNtk->vPis,pObj_00);
      }
    }
    return;
  }
  __assert_fail("Vec_PtrSize(vSupp) == Abc_NtkCiNum(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcOrder.c"
                ,0x70,"void Abc_NtkChangeCiOrder(Abc_Ntk_t *, Vec_Ptr_t *, int)");
}

Assistant:

void Abc_NtkChangeCiOrder( Abc_Ntk_t * pNtk, Vec_Ptr_t * vSupp, int fReverse )
{
    Abc_Obj_t * pObj;
    int i;
    assert( Vec_PtrSize(vSupp) == Abc_NtkCiNum(pNtk) );
    // order CIs using the array
    if ( fReverse )
        Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pObj, i )
            Vec_PtrWriteEntry( pNtk->vCis, Vec_PtrSize(vSupp)-1-i, pObj );
    else
        Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pObj, i )
            Vec_PtrWriteEntry( pNtk->vCis, i, pObj );
    // order PIs accordingly
    Vec_PtrClear( pNtk->vPis );
    Abc_NtkForEachCi( pNtk, pObj, i )
        if ( Abc_ObjIsPi(pObj) )
            Vec_PtrPush( pNtk->vPis, pObj );
//    Abc_NtkForEachCi( pNtk, pObj, i )
//        printf( "%s ", Abc_ObjName(pObj) );
//    printf( "\n" );
}